

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O0

_Bool DiffListIterator_next(DiffListIterator *d)

{
  MCPhysReg MVar1;
  MCPhysReg D;
  DiffListIterator *d_local;
  
  if (d->List == (MCPhysReg *)0x0) {
    d_local._7_1_ = false;
  }
  else {
    MVar1 = *d->List;
    d->List = d->List + 1;
    d->Val = d->Val + MVar1;
    if (MVar1 == 0) {
      d->List = (MCPhysReg *)0x0;
    }
    d_local._7_1_ = MVar1 != 0;
  }
  return d_local._7_1_;
}

Assistant:

static bool DiffListIterator_next(DiffListIterator *d)
{
	MCPhysReg D;

	if (d->List == 0)
		return false;

	D = *d->List;
	d->List++;
	d->Val += D;

	if (!D)
		d->List = 0;

	return (D != 0);
}